

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::add<wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest)

{
  mapped_type *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  SIMDReplaceOp local_1c;
  SIMDReplaceOp rest_local;
  SIMDReplaceOp option_local;
  FeatureOptions<wasm::SIMDReplaceOp> *this_local;
  FeatureSet feature_local;
  
  local_1c = option;
  _rest_local = this;
  this_local._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::push_back
            (this_00,&local_1c);
  pFVar1 = add<>(this,this_local._4_4_,rest);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }